

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::interpretPushThisContext(StackInterpreter *this)

{
  size_t sVar1;
  StackMemory *pSVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  
  sVar1 = this->pc;
  this->pc = sVar1 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar1);
  StackMemory::ensureFrameIsMarried(this->stack);
  pSVar2 = this->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  uVar4 = *(undefined8 *)((pSVar2->stackFrame).framePointer + -0x18);
  (pSVar2->stackFrame).stackPointer = puVar3 + -8;
  *(undefined8 *)(puVar3 + -8) = uVar4;
  return;
}

Assistant:

void interpretPushThisContext()
	{
        fetchNextInstructionOpcode();

        // Ensure my frame is married.
        stack->ensureFrameIsMarried();

        pushOop(stack->getThisContext());
	}